

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recenter.h
# Opt level: O0

uint16_t inv_recenter_nonneg(uint16_t r,uint16_t v)

{
  uint16_t v_local;
  uint16_t r_local;
  undefined2 local_2;
  
  local_2 = v;
  if ((uint)v <= (uint)r * 2) {
    if ((v & 1) == 0) {
      local_2 = (short)((int)(uint)v >> 1) + r;
    }
    else {
      local_2 = r - (short)((int)(v + 1) >> 1);
    }
  }
  return local_2;
}

Assistant:

static inline uint16_t inv_recenter_nonneg(uint16_t r, uint16_t v) {
  if (v > (r << 1))
    return v;
  else if ((v & 1) == 0)
    return (v >> 1) + r;
  else
    return r - ((v + 1) >> 1);
}